

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O3

void __thiscall
BRTS_XZ<UFPC>::FindRunsMem
          (BRTS_XZ<UFPC> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  ulong *puVar1;
  ulong *puVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  pointer puVar6;
  pointer piVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  unsigned_short uVar12;
  long lVar13;
  Run *pRVar14;
  ulong *puVar15;
  ulong uVar16;
  short sVar17;
  Run *pRVar18;
  ulong uVar19;
  unsigned_short uVar20;
  Run *pRVar21;
  Run *pRVar22;
  long lVar23;
  
  piVar7 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar10 = (long)data_width;
  uVar19 = *bits_start;
  sVar17 = 0;
  puVar15 = bits_start;
  pRVar21 = runs;
  while( true ) {
    for (; uVar19 != 0; uVar19 = (~uVar19 >> ((byte)lVar11 & 0x3f)) << ((byte)lVar11 & 0x3f)) {
      lVar11 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
        }
      }
      pRVar21->start_pos = (short)lVar11 + sVar17;
      uVar19 = (~uVar19 >> ((byte)lVar11 & 0x3f)) << ((byte)lVar11 & 0x3f);
      if (uVar19 == 0) {
        do {
          sVar17 = sVar17 + 0x40;
          puVar1 = puVar15 + 1;
          puVar15 = puVar15 + 1;
        } while (*puVar1 == 0xffffffffffffffff);
        uVar19 = ~*puVar1;
      }
      lVar11 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
        }
      }
      pRVar21->end_pos = (short)lVar11 + sVar17;
      uVar9 = UFPC::length_;
      lVar13 = (long)(int)UFPC::length_;
      piVar7[lVar13] = piVar7[lVar13] + 1;
      puVar6[lVar13] = uVar9;
      uVar9 = UFPC::length_ + 1;
      pRVar21->label = UFPC::length_;
      UFPC::length_ = uVar9;
      pRVar21 = pRVar21 + 1;
    }
    puVar15 = puVar15 + 1;
    if (puVar15 == bits_start + lVar10) break;
    sVar17 = sVar17 + 0x40;
    uVar19 = *puVar15;
  }
  pRVar21->start_pos = 0xffff;
  pRVar21->end_pos = 0xffff;
  if (1 < height) {
    uVar19 = 1;
    do {
      pRVar14 = pRVar21 + 1;
      puVar15 = bits_start + uVar19 * lVar10;
      puVar1 = puVar15 + lVar10;
      uVar16 = *puVar15;
      lVar11 = 0;
      pRVar21 = pRVar14;
      while( true ) {
        for (; uVar16 != 0; uVar16 = ~uVar16 & -1L << ((byte)lVar5 & 0x3f)) {
          lVar13 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          uVar16 = (~uVar16 >> ((byte)lVar13 & 0x3f)) << ((byte)lVar13 & 0x3f);
          lVar23 = lVar11;
          if (uVar16 == 0) {
            do {
              lVar23 = lVar23 + 0x40;
              puVar2 = puVar15 + 1;
              puVar15 = puVar15 + 1;
            } while (*puVar2 == 0xffffffffffffffff);
            uVar16 = ~*puVar2;
          }
          lVar5 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          uVar20 = (unsigned_short)(lVar11 + lVar13);
          pRVar22 = runs + -1;
          do {
            pRVar18 = pRVar22;
            runs = runs + 1;
            uVar3 = pRVar18[1].end_pos;
            pRVar22 = pRVar18 + 1;
          } while ((uint)uVar3 < ((uint)(lVar11 + lVar13) & 0xffff));
          uVar12 = (unsigned_short)(lVar5 + lVar23);
          uVar9 = (uint)(lVar5 + lVar23) & 0xffff;
          if (uVar9 < pRVar22->start_pos) {
            pRVar21->start_pos = uVar20;
            pRVar21->end_pos = uVar12;
            uVar9 = UFPC::length_;
            lVar11 = (long)(int)UFPC::length_;
            UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] =
                 UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11] + 1;
            UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar11] = uVar9;
            uVar8 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
          }
          else {
            uVar8 = pRVar18[1].label;
            UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar8] =
                 UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar8] + 1;
            uVar8 = UFPC::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar8];
            while ((pRVar18 = runs, uVar3 < uVar9 &&
                   (pRVar22 = pRVar18, pRVar18->start_pos <= uVar9))) {
              uVar4 = pRVar18->label;
              UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar4] =
                   UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar4] + 1;
              if (uVar8 != UFPC::mem_P_.vec_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[(int)uVar4]) {
                uVar8 = UFPC::MemMerge(uVar8,UFPC::mem_P_.vec_.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start[(int)uVar4]);
              }
              uVar3 = pRVar18->end_pos;
              runs = pRVar18 + 1;
            }
            pRVar21->start_pos = uVar20;
            pRVar21->end_pos = uVar12;
          }
          pRVar21->label = uVar8;
          pRVar21 = pRVar21 + 1;
          lVar11 = lVar23;
          runs = pRVar22;
        }
        puVar15 = puVar15 + 1;
        if (puVar15 == puVar1) break;
        uVar16 = *puVar15;
        lVar11 = lVar11 + 0x40;
      }
      pRVar21->start_pos = 0xffff;
      pRVar21->end_pos = 0xffff;
      uVar19 = uVar19 + 1;
      runs = pRVar14;
    } while (uVar19 != (uint)height);
  }
  uVar9 = UFPC::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
  return;
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::MemGetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::MemMerge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }